

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alignment_test.cpp
# Opt level: O0

void flatbuffers::tests::AlignmentTest(void)

{
  allocator<EvenSmallStruct> *this;
  allocator<OddSmallStruct> *this_00;
  initializer_list<OddSmallStruct> __l;
  initializer_list<EvenSmallStruct> __l_00;
  bool bVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  Offset<OuterLarge> large_00;
  Offset<flatbuffers::Vector<const_BadAlignmentSmall_*,_unsigned_int>_> small_00;
  Offset<BadAlignmentRoot> root_00;
  SizeT SVar4;
  Offset<flatbuffers::Vector<const_EvenSmallStruct_*,_unsigned_int>_> even_structs;
  Offset<flatbuffers::Vector<const_OddSmallStruct_*,_unsigned_int>_> odd_structs;
  uint uVar5;
  size_t buffer_minalign;
  uint8_t *puVar6;
  SmallStructs *this_01;
  Vector<const_EvenSmallStruct_*,_unsigned_int> *pVVar7;
  size_type_conflict sVar8;
  reference pvVar9;
  return_type pEVar10;
  Vector<const_OddSmallStruct_*,_unsigned_int> *pVVar11;
  reference pvVar12;
  return_type pOVar13;
  uint local_1e0;
  uint local_1dc;
  uoffset_t i_1;
  uoffset_t i;
  SmallStructs *root_msg;
  Verifier verifier_small_structs;
  Offset<SmallStructs> small_structs_root;
  Offset<flatbuffers::Vector<const_OddSmallStruct_*,_unsigned_int>_> odd_structs_offset;
  Offset<flatbuffers::Vector<const_EvenSmallStruct_*,_unsigned_int>_> even_structs_offset;
  OddSmallStruct local_163;
  iterator local_160;
  size_type_conflict local_158;
  undefined1 local_150 [8];
  vector<OddSmallStruct,_std::allocator<OddSmallStruct>_> odd_vector;
  undefined1 local_120 [8];
  vector<EvenSmallStruct,_std::allocator<EvenSmallStruct>_> even_vector;
  Verifier verifier;
  Offset<BadAlignmentRoot> root;
  Offset<flatbuffers::Vector<const_BadAlignmentSmall_*,_unsigned_int>_> small_offset;
  BadAlignmentSmall *small;
  Offset<OuterLarge> outer_large;
  BadAlignmentLarge local_90;
  BadAlignmentLarge large;
  FlatBufferBuilder builder;
  
  buffer_minalign = AlignOf<unsigned_long>();
  FlatBufferBuilderImpl<false>::FlatBufferBuilderImpl
            ((FlatBufferBuilderImpl<false> *)&large,0x400,(Allocator *)0x0,false,buffer_minalign);
  BadAlignmentLarge::BadAlignmentLarge(&local_90);
  large_00 = CreateOuterLarge((FlatBufferBuilder *)&large,&local_90);
  small_00 = FlatBufferBuilderImpl<false>::CreateUninitializedVectorOfStructs<BadAlignmentSmall>
                       ((FlatBufferBuilderImpl<false> *)&large,9,(BadAlignmentSmall **)&root);
  root_00 = CreateBadAlignmentRoot((FlatBufferBuilder *)&large,large_00,small_00);
  FlatBufferBuilderImpl<false>::Finish<BadAlignmentRoot>
            ((FlatBufferBuilderImpl<false> *)&large,root_00,(char *)0x0);
  puVar6 = FlatBufferBuilderImpl<false>::GetBufferPointer((FlatBufferBuilderImpl<false> *)&large);
  SVar4 = FlatBufferBuilderImpl<false>::GetSize((FlatBufferBuilderImpl<false> *)&large);
  VerifierTemplate<false>::VerifierTemplate
            ((VerifierTemplate<false> *)
             &even_vector.super__Vector_base<EvenSmallStruct,_std::allocator<EvenSmallStruct>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,puVar6,(ulong)SVar4,0x40,1000000,
             true);
  bVar1 = VerifierTemplate<false>::VerifyBuffer<BadAlignmentRoot>
                    ((VerifierTemplate<false> *)
                     &even_vector.
                      super__Vector_base<EvenSmallStruct,_std::allocator<EvenSmallStruct>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,(char *)0x0);
  TestEq<bool,bool>(true,bVar1,"\'true\' != \'verifier.VerifyBuffer<BadAlignmentRoot>(nullptr)\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/alignment_test.cpp"
                    ,0x1c,"");
  FlatBufferBuilderImpl<false>::Clear((FlatBufferBuilderImpl<false> *)&large);
  EvenSmallStruct::EvenSmallStruct
            ((EvenSmallStruct *)
             ((long)&odd_vector.super__Vector_base<OddSmallStruct,_std::allocator<OddSmallStruct>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 2),'\x02','\x01');
  EvenSmallStruct::EvenSmallStruct
            ((EvenSmallStruct *)
             ((long)&odd_vector.super__Vector_base<OddSmallStruct,_std::allocator<OddSmallStruct>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 4),'\x03','\x01');
  EvenSmallStruct::EvenSmallStruct
            ((EvenSmallStruct *)
             ((long)&odd_vector.super__Vector_base<OddSmallStruct,_std::allocator<OddSmallStruct>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 6),'\x04','\x01');
  this = (allocator<EvenSmallStruct> *)
         ((long)&odd_vector.super__Vector_base<OddSmallStruct,_std::allocator<OddSmallStruct>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
  std::allocator<EvenSmallStruct>::allocator(this);
  __l_00._M_len = 3;
  __l_00._M_array =
       (iterator)
       ((long)&odd_vector.super__Vector_base<OddSmallStruct,_std::allocator<OddSmallStruct>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage + 2);
  std::vector<EvenSmallStruct,_std::allocator<EvenSmallStruct>_>::vector
            ((vector<EvenSmallStruct,_std::allocator<EvenSmallStruct>_> *)local_120,__l_00,this);
  std::allocator<EvenSmallStruct>::~allocator
            ((allocator<EvenSmallStruct> *)
             ((long)&odd_vector.super__Vector_base<OddSmallStruct,_std::allocator<OddSmallStruct>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
  OddSmallStruct::OddSmallStruct
            ((OddSmallStruct *)((long)&odd_structs_offset.o + 3),'\x06','\x05','\x04');
  OddSmallStruct::OddSmallStruct
            ((OddSmallStruct *)((long)&even_structs_offset.o + 2),'\t','\b','\a');
  OddSmallStruct::OddSmallStruct(&local_163,'\x01','\x02','\x03');
  local_160 = (iterator)((long)&odd_structs_offset.o + 3);
  local_158 = 3;
  this_00 = (allocator<OddSmallStruct> *)((long)&odd_structs_offset.o + 2);
  std::allocator<OddSmallStruct>::allocator(this_00);
  __l._M_len = local_158;
  __l._M_array = local_160;
  std::vector<OddSmallStruct,_std::allocator<OddSmallStruct>_>::vector
            ((vector<OddSmallStruct,_std::allocator<OddSmallStruct>_> *)local_150,__l,this_00);
  std::allocator<OddSmallStruct>::~allocator
            ((allocator<OddSmallStruct> *)((long)&odd_structs_offset.o + 2));
  even_structs = FlatBufferBuilderImpl<false>::
                 CreateVectorOfStructs<EvenSmallStruct,_flatbuffers::Offset,_flatbuffers::Vector,_std::allocator<EvenSmallStruct>_>
                           ((FlatBufferBuilderImpl<false> *)&large,
                            (vector<EvenSmallStruct,_std::allocator<EvenSmallStruct>_> *)local_120);
  odd_structs = FlatBufferBuilderImpl<false>::
                CreateVectorOfStructs<OddSmallStruct,_flatbuffers::Offset,_flatbuffers::Vector,_std::allocator<OddSmallStruct>_>
                          ((FlatBufferBuilderImpl<false> *)&large,
                           (vector<OddSmallStruct,_std::allocator<OddSmallStruct>_> *)local_150);
  verifier_small_structs.flex_reuse_tracker_._4_4_ =
       CreateSmallStructs((FlatBufferBuilder *)&large,even_structs,odd_structs);
  FlatBufferBuilderImpl<false>::Finish<SmallStructs>
            ((FlatBufferBuilderImpl<false> *)&large,verifier_small_structs.flex_reuse_tracker_._4_4_
             ,(char *)0x0);
  puVar6 = FlatBufferBuilderImpl<false>::GetBufferPointer((FlatBufferBuilderImpl<false> *)&large);
  SVar4 = FlatBufferBuilderImpl<false>::GetSize((FlatBufferBuilderImpl<false> *)&large);
  VerifierTemplate<false>::VerifierTemplate
            ((VerifierTemplate<false> *)&root_msg,puVar6,(ulong)SVar4,0x40,1000000,true);
  bVar1 = VerifierTemplate<false>::VerifyBuffer<SmallStructs>
                    ((VerifierTemplate<false> *)&root_msg,(char *)0x0);
  TestEq<bool,bool>(true,bVar1,
                    "\'true\' != \'verifier_small_structs.VerifyBuffer<SmallStructs>(nullptr)\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/alignment_test.cpp"
                    ,0x3e,"");
  puVar6 = FlatBufferBuilderImpl<false>::GetBufferPointer((FlatBufferBuilderImpl<false> *)&large);
  this_01 = GetRoot<SmallStructs>(puVar6);
  pVVar7 = SmallStructs::even_structs(this_01);
  uVar5 = Vector<const_EvenSmallStruct_*,_unsigned_int>::size(pVVar7);
  sVar8 = std::vector<EvenSmallStruct,_std::allocator<EvenSmallStruct>_>::size
                    ((vector<EvenSmallStruct,_std::allocator<EvenSmallStruct>_> *)local_120);
  TestEq<unsigned_int,unsigned_long>
            (uVar5,sVar8,"\'root_msg->even_structs()->size()\' != \'even_vector.size()\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/alignment_test.cpp"
             ,0x44,"");
  local_1dc = 0;
  while( true ) {
    pVVar7 = SmallStructs::even_structs(this_01);
    uVar5 = Vector<const_EvenSmallStruct_*,_unsigned_int>::size(pVVar7);
    if (uVar5 <= local_1dc) break;
    pvVar9 = std::vector<EvenSmallStruct,_std::allocator<EvenSmallStruct>_>::operator[]
                       ((vector<EvenSmallStruct,_std::allocator<EvenSmallStruct>_> *)local_120,
                        (ulong)local_1dc);
    uVar2 = EvenSmallStruct::var_0(pvVar9);
    pVVar7 = SmallStructs::even_structs(this_01);
    pEVar10 = Vector<const_EvenSmallStruct_*,_unsigned_int>::Get(pVVar7,local_1dc);
    uVar3 = EvenSmallStruct::var_0(pEVar10);
    TestEq<unsigned_char,unsigned_char>
              (uVar2,uVar3,
               "\'even_vector[i].var_0()\' != \'root_msg->even_structs()->Get(i)->var_0()\'",
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/alignment_test.cpp"
               ,0x47,"");
    pvVar9 = std::vector<EvenSmallStruct,_std::allocator<EvenSmallStruct>_>::operator[]
                       ((vector<EvenSmallStruct,_std::allocator<EvenSmallStruct>_> *)local_120,
                        (ulong)local_1dc);
    uVar2 = EvenSmallStruct::var_1(pvVar9);
    pVVar7 = SmallStructs::even_structs(this_01);
    pEVar10 = Vector<const_EvenSmallStruct_*,_unsigned_int>::Get(pVVar7,local_1dc);
    uVar3 = EvenSmallStruct::var_1(pEVar10);
    TestEq<unsigned_char,unsigned_char>
              (uVar2,uVar3,
               "\'even_vector[i].var_1()\' != \'root_msg->even_structs()->Get(i)->var_1()\'",
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/alignment_test.cpp"
               ,0x48,"");
    local_1dc = local_1dc + 1;
  }
  pVVar11 = SmallStructs::odd_structs(this_01);
  uVar5 = Vector<const_OddSmallStruct_*,_unsigned_int>::size(pVVar11);
  sVar8 = std::vector<EvenSmallStruct,_std::allocator<EvenSmallStruct>_>::size
                    ((vector<EvenSmallStruct,_std::allocator<EvenSmallStruct>_> *)local_120);
  TestEq<unsigned_int,unsigned_long>
            (uVar5,sVar8,"\'root_msg->odd_structs()->size()\' != \'even_vector.size()\'",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/alignment_test.cpp"
             ,0x4b,"");
  local_1e0 = 0;
  while( true ) {
    pVVar11 = SmallStructs::odd_structs(this_01);
    uVar5 = Vector<const_OddSmallStruct_*,_unsigned_int>::size(pVVar11);
    if (uVar5 <= local_1e0) break;
    pvVar12 = std::vector<OddSmallStruct,_std::allocator<OddSmallStruct>_>::operator[]
                        ((vector<OddSmallStruct,_std::allocator<OddSmallStruct>_> *)local_150,
                         (ulong)local_1e0);
    uVar2 = OddSmallStruct::var_0(pvVar12);
    pVVar11 = SmallStructs::odd_structs(this_01);
    pOVar13 = Vector<const_OddSmallStruct_*,_unsigned_int>::Get(pVVar11,local_1e0);
    uVar3 = OddSmallStruct::var_0(pOVar13);
    TestEq<unsigned_char,unsigned_char>
              (uVar2,uVar3,
               "\'odd_vector[i].var_0()\' != \'root_msg->odd_structs()->Get(i)->var_0()\'",
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/alignment_test.cpp"
               ,0x4d,"");
    pvVar12 = std::vector<OddSmallStruct,_std::allocator<OddSmallStruct>_>::operator[]
                        ((vector<OddSmallStruct,_std::allocator<OddSmallStruct>_> *)local_150,
                         (ulong)local_1e0);
    uVar2 = OddSmallStruct::var_1(pvVar12);
    pVVar11 = SmallStructs::odd_structs(this_01);
    pOVar13 = Vector<const_OddSmallStruct_*,_unsigned_int>::Get(pVVar11,local_1e0);
    uVar3 = OddSmallStruct::var_1(pOVar13);
    TestEq<unsigned_char,unsigned_char>
              (uVar2,uVar3,
               "\'odd_vector[i].var_1()\' != \'root_msg->odd_structs()->Get(i)->var_1()\'",
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/alignment_test.cpp"
               ,0x4e,"");
    local_1e0 = local_1e0 + 1;
  }
  std::vector<OddSmallStruct,_std::allocator<OddSmallStruct>_>::~vector
            ((vector<OddSmallStruct,_std::allocator<OddSmallStruct>_> *)local_150);
  std::vector<EvenSmallStruct,_std::allocator<EvenSmallStruct>_>::~vector
            ((vector<EvenSmallStruct,_std::allocator<EvenSmallStruct>_> *)local_120);
  FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl((FlatBufferBuilderImpl<false> *)&large);
  return;
}

Assistant:

void AlignmentTest() {
  FlatBufferBuilder builder;

  BadAlignmentLarge large;
  Offset<OuterLarge> outer_large = CreateOuterLarge(builder, &large);

  BadAlignmentSmall *small;
  Offset<Vector<const BadAlignmentSmall *>> small_offset =
      builder.CreateUninitializedVectorOfStructs(9, &small);
  (void)small;  // We do not have to write data to trigger the test failure

  Offset<BadAlignmentRoot> root =
      CreateBadAlignmentRoot(builder, outer_large, small_offset);

  builder.Finish(root);

  Verifier verifier(builder.GetBufferPointer(), builder.GetSize());
  TEST_ASSERT(verifier.VerifyBuffer<BadAlignmentRoot>(nullptr));


  // ============= Test Small Structs Vector misalignment ========

  builder.Clear();

  // creating 5 structs with 2 bytes each
  // 10 bytes in total for Vector data is needed
  std::vector<EvenSmallStruct> even_vector = { { 2, 1 }, { 3, 1 }, { 4, 1 } };
  std::vector<OddSmallStruct> odd_vector = { { 6, 5, 4 },
                                             { 9, 8, 7 },
                                             { 1, 2, 3 } };
  // CreateVectorOfStructs is used in the generated CreateSmallStructsDirect()
  // method, but we test it directly
  Offset<Vector<const EvenSmallStruct *>> even_structs_offset =
      builder.CreateVectorOfStructs<EvenSmallStruct>(even_vector);
  Offset<Vector<const OddSmallStruct *>> odd_structs_offset =
      builder.CreateVectorOfStructs<OddSmallStruct>(odd_vector);
  Offset<SmallStructs> small_structs_root =
      CreateSmallStructs(builder, even_structs_offset, odd_structs_offset);

  builder.Finish(small_structs_root);

  // Save the binary that we later can annotate with `flatc --annotate` command
  // NOTE: the conversion of the JSON data to --binary via `flatc --binary`
  //       command is not changed with that fix and was always producing the
  //       correct binary data.
  // SaveFile("alignment_test_{before,after}_fix.bin",
  //          reinterpret_cast<char *>(builder.GetBufferPointer()),
  //          builder.GetSize(), true);

  Verifier verifier_small_structs(builder.GetBufferPointer(),
                                  builder.GetSize());
  TEST_ASSERT(verifier_small_structs.VerifyBuffer<SmallStructs>(nullptr));

  // Reading SmallStructs vector values back and compare with original
  auto root_msg =
      flatbuffers::GetRoot<SmallStructs>(builder.GetBufferPointer());

  TEST_EQ(root_msg->even_structs()->size(), even_vector.size());
  for (flatbuffers::uoffset_t i = 0; i < root_msg->even_structs()->size();
       ++i) {
    TEST_EQ(even_vector[i].var_0(), root_msg->even_structs()->Get(i)->var_0());
    TEST_EQ(even_vector[i].var_1(), root_msg->even_structs()->Get(i)->var_1());
  }

  TEST_EQ(root_msg->odd_structs()->size(), even_vector.size());
  for (flatbuffers::uoffset_t i = 0; i < root_msg->odd_structs()->size(); ++i) {
    TEST_EQ(odd_vector[i].var_0(), root_msg->odd_structs()->Get(i)->var_0());
    TEST_EQ(odd_vector[i].var_1(), root_msg->odd_structs()->Get(i)->var_1());
  }
}